

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

int AF_A_SelectSigilDown(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  DPSprite *this_01;
  FState *pFVar1;
  bool bVar2;
  bool local_62;
  bool local_5f;
  int local_5c;
  int pieces;
  DPSprite *pspr;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x36c,"int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (DObject *)(param->field_0).field_1.a;
    local_5f = true;
    if (this != (DObject *)0x0) {
      local_5f = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_5f != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
          bVar2 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x36c,
                        "int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)")
          ;
        }
        this_00 = (DObject *)param[1].field_0.field_1.a;
        local_62 = true;
        if (this_00 != (DObject *)0x0) {
          local_62 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        }
        if (local_62 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x36c,
                        "int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)")
          ;
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
          bVar2 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                        ,0x36c,
                        "int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)")
          ;
        }
      }
      if (*(long *)&this[0xc].ObjectFlags != 0) {
        local_5c = *(int *)(*(long *)(*(long *)&this[0xc].ObjectFlags + 0xd0) + 0x588);
        *(undefined4 *)(*(long *)(*(long *)&this[0xc].ObjectFlags + 0xd0) + 0x588) = 0;
        if (local_5c == 0) {
          local_5c = *(int *)(*(long *)(*(long *)&this[0xc].ObjectFlags + 0xd0) + 0x584);
        }
        this_01 = player_t::GetPSprite(*(player_t **)&this[0xc].ObjectFlags,PSP_WEAPON);
        pFVar1 = DPSprite::GetState(this_01);
        DPSprite::SetState(this_01,pFVar1 + local_5c,false);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x36c,"int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x36c,"int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectSigilDown)
{
	PARAM_ACTION_PROLOGUE;

	DPSprite *pspr;
	int pieces;

	if (self->player == nullptr)
	{
		return 0;
	}
	pieces = static_cast<ASigil*>(self->player->ReadyWeapon)->DownPieces;
	static_cast<ASigil*>(self->player->ReadyWeapon)->DownPieces = 0;
	if (pieces == 0)
	{
		pieces = static_cast<ASigil*>(self->player->ReadyWeapon)->NumPieces;
	}
	pspr = self->player->GetPSprite(PSP_WEAPON);
	pspr->SetState(pspr->GetState() + pieces);
	return 0;
}